

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<std::pair<unsigned_int,_const_QMetaObject_*>_>::detachAndGrow
          (QArrayDataPointer<std::pair<unsigned_int,_const_QMetaObject_*>_> *this,
          GrowthPosition where,qsizetype n,pair<unsigned_int,_const_QMetaObject_*> **data,
          QArrayDataPointer<std::pair<unsigned_int,_const_QMetaObject_*>_> *old)

{
  Data *pDVar1;
  bool bVar2;
  GrowthPosition pos;
  
  pDVar1 = this->d;
  if ((pDVar1 != (Data *)0x0) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (n != 0) {
      if (where == GrowsAtEnd) {
        if (n <= (pDVar1->super_QArrayData).alloc -
                 (((long)((long)this->ptr -
                         ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0
                         )) >> 4) + this->size)) {
          return;
        }
        pos = GrowsAtEnd;
      }
      else {
        pos = where;
        if ((where == GrowsAtBeginning) &&
           (n <= (long)((long)this->ptr -
                       ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
                 >> 4)) {
          return;
        }
      }
      bVar2 = tryReadjustFreeSpace(this,pos,n,data);
      if (!bVar2) goto LAB_00588557;
    }
    return;
  }
LAB_00588557:
  reallocateAndGrow(this,where,n,old);
  return;
}

Assistant:

void detachAndGrow(QArrayData::GrowthPosition where, qsizetype n, const T **data,
                       QArrayDataPointer *old)
    {
        const bool detach = needsDetach();
        bool readjusted = false;
        if (!detach) {
            if (!n || (where == QArrayData::GrowsAtBeginning && freeSpaceAtBegin() >= n)
                || (where == QArrayData::GrowsAtEnd && freeSpaceAtEnd() >= n))
                return;
            readjusted = tryReadjustFreeSpace(where, n, data);
            Q_ASSERT(!readjusted
                     || (where == QArrayData::GrowsAtBeginning && freeSpaceAtBegin() >= n)
                     || (where == QArrayData::GrowsAtEnd && freeSpaceAtEnd() >= n));
        }

        if (!readjusted)
            reallocateAndGrow(where, n, old);
    }